

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

char * __thiscall QFileSystemModel::index(QFileSystemModel *this,char *__s,int __c)

{
  QFileSystemModelPrivate *this_00;
  bool bVar1;
  int iVar2;
  QFileSystemNode *pQVar3;
  uint in_ECX;
  QModelIndex *in_R8;
  
  if (-1 < (int)(in_ECX | __c)) {
    this_00 = *(QFileSystemModelPrivate **)(__s + 8);
    iVar2 = (**(code **)(*(long *)__s + 0x78))(__s);
    if ((__c < iVar2) && (iVar2 = (**(code **)(*(long *)__s + 0x80))(__s), (int)in_ECX < iVar2)) {
      bVar1 = QAbstractItemModelPrivate::indexValid(&this_00->super_QAbstractItemModelPrivate,in_R8)
      ;
      if (bVar1) {
        pQVar3 = QFileSystemModelPrivate::node(this_00,in_R8);
      }
      else {
        pQVar3 = &this_00->root;
      }
      iVar2 = QFileSystemModelPrivate::translateVisibleLocation(this_00,pQVar3,__c);
      if ((long)iVar2 < (pQVar3->visibleChildren).d.size) {
        pQVar3 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                           (&pQVar3->children,(pQVar3->visibleChildren).d.ptr + iVar2);
        *(int *)this = __c;
        *(uint *)&this->field_0x4 = in_ECX;
        *(QFileSystemNode **)&this->field_0x8 = pQVar3;
        *(char **)(this + 1) = __s;
        return (char *)this;
      }
    }
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)(this + 1) = 0;
  return (char *)this;
}

Assistant:

QModelIndex QFileSystemModel::index(int row, int column, const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (row < 0 || column < 0 || row >= rowCount(parent) || column >= columnCount(parent))
        return QModelIndex();

    // get the parent node
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (d->indexValid(parent) ? d->node(parent) :
                                                   const_cast<QFileSystemModelPrivate::QFileSystemNode*>(&d->root));
    Q_ASSERT(parentNode);

    // now get the internal pointer for the index
    const int i = d->translateVisibleLocation(parentNode, row);
    if (i >= parentNode->visibleChildren.size())
        return QModelIndex();
    const QString &childName = parentNode->visibleChildren.at(i);
    const QFileSystemModelPrivate::QFileSystemNode *indexNode = parentNode->children.value(childName);
    Q_ASSERT(indexNode);

    return createIndex(row, column, indexNode);
}